

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O3

void streamFile(char *filename)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *__addr;
  xmlTextReaderPtr reader;
  undefined8 *puVar5;
  undefined8 uVar6;
  size_t unaff_R14;
  stat info;
  stat64 local_c0;
  
  if (memory == 0) {
    __addr = (void *)0x0;
    reader = (xmlTextReaderPtr)xmlReaderForFile(filename,0,options);
    iVar2 = -1;
  }
  else {
    iVar2 = stat64(filename,&local_c0);
    if (iVar2 < 0) {
      return;
    }
    iVar2 = open64(filename,0);
    if (iVar2 < 0) {
      return;
    }
    __addr = mmap64((void *)0x0,local_c0.st_size,1,1,iVar2,0);
    if (__addr == (void *)0xffffffffffffffff) {
      streamFile_cold_1();
      return;
    }
    reader = (xmlTextReaderPtr)
             xmlReaderForMemory(__addr,local_c0.st_size & 0xffffffff,filename,0,options);
    unaff_R14 = local_c0.st_size;
  }
  if (pattern == (char *)0x0) {
LAB_00108197:
    if (patternc != (xmlPatternPtr)0x0) goto LAB_001081a3;
  }
  else {
    patternc = (xmlPatternPtr)xmlPatterncompile(pattern,0,0,0);
    if (patternc == (xmlPatternPtr)0x0) {
      puVar5 = (undefined8 *)__xmlGenericError(0);
      pcVar1 = (code *)*puVar5;
      puVar5 = (undefined8 *)__xmlGenericErrorContext();
      (*pcVar1)(*puVar5,"Pattern %s failed to compile\n",pattern);
      progresult = XMLLINT_ERR_SCHEMAPAT;
      pattern = (char *)0x0;
      goto LAB_00108197;
    }
LAB_001081a3:
    patstream = (xmlStreamCtxtPtr)xmlPatternGetStreamCtxt();
    if ((patstream != (xmlStreamCtxtPtr)0x0) && (iVar3 = xmlStreamPush(patstream,0,0), iVar3 < 0)) {
      streamFile_cold_2();
    }
  }
  if (reader != (xmlTextReaderPtr)0x0) {
    uVar6 = 3;
    if ((valid != 0) || (uVar6 = 1, loaddtd != 0)) {
      xmlTextReaderSetParserProp(reader,uVar6,1);
    }
    if (relaxng != (char *)0x0) {
      if (repeat == 0 && timing != 0) {
        gettimeofday((timeval *)&begin,(__timezone_ptr_t)0x0);
      }
      iVar3 = xmlTextReaderRelaxNGValidate(reader,relaxng);
      if (iVar3 < 0) {
        puVar5 = (undefined8 *)__xmlGenericError();
        pcVar1 = (code *)*puVar5;
        puVar5 = (undefined8 *)__xmlGenericErrorContext();
        (*pcVar1)(*puVar5,"Relax-NG schema %s failed to compile\n",relaxng);
        progresult = XMLLINT_ERR_SCHEMACOMP;
        relaxng = (char *)0x0;
      }
      if (repeat == 0 && timing != 0) {
        endTimer("Compiling the schemas");
      }
    }
    if (schema != (char *)0x0) {
      if (repeat == 0 && timing != 0) {
        gettimeofday((timeval *)&begin,(__timezone_ptr_t)0x0);
      }
      iVar3 = xmlTextReaderSchemaValidate(reader,schema);
      if (iVar3 < 0) {
        puVar5 = (undefined8 *)__xmlGenericError();
        pcVar1 = (code *)*puVar5;
        puVar5 = (undefined8 *)__xmlGenericErrorContext();
        (*pcVar1)(*puVar5,"XSD schema %s failed to compile\n",schema);
        progresult = XMLLINT_ERR_SCHEMACOMP;
        schema = (char *)0x0;
      }
      if (repeat == 0 && timing != 0) {
        endTimer("Compiling the schemas");
      }
    }
    if ((timing != 0) && (repeat == 0)) {
      gettimeofday((timeval *)&begin,(__timezone_ptr_t)0x0);
    }
    while (iVar3 = xmlTextReaderRead(reader), iVar3 == 1) {
      if ((debug != 0) || (patternc != (xmlPatternPtr)0x0)) {
        processNode(reader);
      }
    }
    if ((timing != 0) && (repeat == 0)) {
      streamFile_cold_3();
    }
    if ((valid != 0) && (iVar4 = xmlTextReaderIsValid(reader), iVar4 != 1)) {
      puVar5 = (undefined8 *)__xmlGenericError();
      pcVar1 = (code *)*puVar5;
      puVar5 = (undefined8 *)__xmlGenericErrorContext();
      (*pcVar1)(*puVar5,"Document %s does not validate\n",filename);
      progresult = XMLLINT_ERR_VALID;
    }
    if (schema != (char *)0x0 || relaxng != (char *)0x0) {
      iVar4 = xmlTextReaderIsValid(reader);
      if (iVar4 == 1) {
        fprintf(_stderr,"%s validates\n",filename);
      }
      else {
        fprintf(_stderr,"%s fails to validate\n",filename);
        progresult = XMLLINT_ERR_VALID;
      }
    }
    xmlFreeTextReader(reader);
    if (iVar3 == 0) goto LAB_00108401;
  }
  streamFile_cold_4();
LAB_00108401:
  if (patstream != (xmlStreamCtxtPtr)0x0) {
    xmlFreeStreamCtxt();
    patstream = (xmlStreamCtxtPtr)0x0;
  }
  if (memory == 0) {
    return;
  }
  xmlFreeParserInputBuffer(0);
  munmap(__addr,unaff_R14);
  close(iVar2);
  return;
}

Assistant:

static void streamFile(char *filename) {
    xmlTextReaderPtr reader;
    int ret;
#ifdef HAVE_MMAP
    int fd = -1;
    struct stat info;
    const char *base = NULL;
    xmlParserInputBufferPtr input = NULL;

    if (memory) {
	if (stat(filename, &info) < 0)
	    return;
	if ((fd = open(filename, O_RDONLY)) < 0)
	    return;
	base = mmap(NULL, info.st_size, PROT_READ, MAP_SHARED, fd, 0) ;
	if (base == (void *) MAP_FAILED) {
	    close(fd);
	    fprintf(stderr, "mmap failure for file %s\n", filename);
	    progresult = XMLLINT_ERR_RDFILE;
	    return;
	}

	reader = xmlReaderForMemory(base, info.st_size, filename,
	                            NULL, options);
    } else
#endif
	reader = xmlReaderForFile(filename, NULL, options);
#ifdef LIBXML_PATTERN_ENABLED
    if (pattern != NULL) {
        patternc = xmlPatterncompile((const xmlChar *) pattern, NULL, 0, NULL);
	if (patternc == NULL) {
	    xmlGenericError(xmlGenericErrorContext,
		    "Pattern %s failed to compile\n", pattern);
            progresult = XMLLINT_ERR_SCHEMAPAT;
	    pattern = NULL;
	}
    }
    if (patternc != NULL) {
        patstream = xmlPatternGetStreamCtxt(patternc);
	if (patstream != NULL) {
	    ret = xmlStreamPush(patstream, NULL, NULL);
	    if (ret < 0) {
		fprintf(stderr, "xmlStreamPush() failure\n");
		xmlFreeStreamCtxt(patstream);
		patstream = NULL;
            }
	}
    }
#endif


    if (reader != NULL) {
#ifdef LIBXML_VALID_ENABLED
	if (valid)
	    xmlTextReaderSetParserProp(reader, XML_PARSER_VALIDATE, 1);
	else
#endif /* LIBXML_VALID_ENABLED */
	    if (loaddtd)
		xmlTextReaderSetParserProp(reader, XML_PARSER_LOADDTD, 1);
#ifdef LIBXML_SCHEMAS_ENABLED
	if (relaxng != NULL) {
	    if ((timing) && (!repeat)) {
		startTimer();
	    }
	    ret = xmlTextReaderRelaxNGValidate(reader, relaxng);
	    if (ret < 0) {
		xmlGenericError(xmlGenericErrorContext,
			"Relax-NG schema %s failed to compile\n", relaxng);
		progresult = XMLLINT_ERR_SCHEMACOMP;
		relaxng = NULL;
	    }
	    if ((timing) && (!repeat)) {
		endTimer("Compiling the schemas");
	    }
	}
	if (schema != NULL) {
	    if ((timing) && (!repeat)) {
		startTimer();
	    }
	    ret = xmlTextReaderSchemaValidate(reader, schema);
	    if (ret < 0) {
		xmlGenericError(xmlGenericErrorContext,
			"XSD schema %s failed to compile\n", schema);
		progresult = XMLLINT_ERR_SCHEMACOMP;
		schema = NULL;
	    }
	    if ((timing) && (!repeat)) {
		endTimer("Compiling the schemas");
	    }
	}
#endif

	/*
	 * Process all nodes in sequence
	 */
	if ((timing) && (!repeat)) {
	    startTimer();
	}
	ret = xmlTextReaderRead(reader);
	while (ret == 1) {
	    if ((debug)
#ifdef LIBXML_PATTERN_ENABLED
	        || (patternc)
#endif
	       )
		processNode(reader);
	    ret = xmlTextReaderRead(reader);
	}
	if ((timing) && (!repeat)) {
#ifdef LIBXML_SCHEMAS_ENABLED
	    if (relaxng != NULL)
		endTimer("Parsing and validating");
	    else
#endif
#ifdef LIBXML_VALID_ENABLED
	    if (valid)
		endTimer("Parsing and validating");
	    else
#endif
	    endTimer("Parsing");
	}

#ifdef LIBXML_VALID_ENABLED
	if (valid) {
	    if (xmlTextReaderIsValid(reader) != 1) {
		xmlGenericError(xmlGenericErrorContext,
			"Document %s does not validate\n", filename);
		progresult = XMLLINT_ERR_VALID;
	    }
	}
#endif /* LIBXML_VALID_ENABLED */
#ifdef LIBXML_SCHEMAS_ENABLED
	if ((relaxng != NULL) || (schema != NULL)) {
	    if (xmlTextReaderIsValid(reader) != 1) {
		fprintf(stderr, "%s fails to validate\n", filename);
		progresult = XMLLINT_ERR_VALID;
	    } else {
		fprintf(stderr, "%s validates\n", filename);
	    }
	}
#endif
	/*
	 * Done, cleanup and status
	 */
	xmlFreeTextReader(reader);
	if (ret != 0) {
	    fprintf(stderr, "%s : failed to parse\n", filename);
	    progresult = XMLLINT_ERR_UNCLASS;
	}
    } else {
	fprintf(stderr, "Unable to open %s\n", filename);
	progresult = XMLLINT_ERR_UNCLASS;
    }
#ifdef LIBXML_PATTERN_ENABLED
    if (patstream != NULL) {
	xmlFreeStreamCtxt(patstream);
	patstream = NULL;
    }
#endif
#ifdef HAVE_MMAP
    if (memory) {
        xmlFreeParserInputBuffer(input);
	munmap((char *) base, info.st_size);
	close(fd);
    }
#endif
}